

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

PyObject * get_dict(PyObject *op,void *param_2)

{
  long *plVar1;
  PyObject *pPVar2;
  
  plVar1 = (long *)_PyObject_GetDictPtr();
  pPVar2 = (PyObject *)*plVar1;
  if (pPVar2 == (PyObject *)0x0) {
    pPVar2 = (PyObject *)PyDict_New();
    *plVar1 = (long)pPVar2;
    if (pPVar2 == (PyObject *)0x0) {
      return (PyObject *)0x0;
    }
  }
  pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
  return pPVar2;
}

Assistant:

inline PyObject *get_dict(PyObject *op, void *) {
    PyObject *&dict = *_PyObject_GetDictPtr(op);
    if (!dict)
        dict = PyDict_New();
    Py_XINCREF(dict);
    return dict;
}